

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

void __thiscall
testing::internal::
CartesianProductGenerator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_>::IteratorImpl
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *this,
          ParamGeneratorInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
          *base,tuple<testing::internal::ParamGenerator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_testing::internal::ParamGenerator<BLOCK_SIZE>_>
                *generators,bool is_end)

{
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Tuple_impl<0UL,_testing::internal::ParamIterator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_testing::internal::ParamIterator<BLOCK_SIZE>_>
  *p_Var1;
  ParamIterator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)> local_40;
  ParamIterator<BLOCK_SIZE> local_38;
  
  (this->
  super_ParamIteratorInterface<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>_>
  )._vptr_ParamIteratorInterface = (_func_int **)&PTR__IteratorImpl_01098180;
  this->base_ = base;
  local_40.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>_*,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>_*,_false>
  ._M_head_impl._0_4_ =
       (*((generators->
          super__Tuple_impl<0UL,_testing::internal::ParamGenerator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_testing::internal::ParamGenerator<BLOCK_SIZE>_>
          ).
          super__Head_base<0UL,_testing::internal::ParamGenerator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_false>
          ._M_head_impl.impl_.
          super___shared_ptr<const_testing::internal::ParamGeneratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->_vptr_ParamGeneratorInterface[2])();
  local_40.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>_*,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>_*,_false>
  ._M_head_impl._4_4_ = extraout_var;
  local_38.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<BLOCK_SIZE>,_std::default_delete<testing::internal::ParamIteratorInterface<BLOCK_SIZE>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<BLOCK_SIZE>_*,_std::default_delete<testing::internal::ParamIteratorInterface<BLOCK_SIZE>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<BLOCK_SIZE>_*,_false>.
  _M_head_impl = (unique_ptr<testing::internal::ParamIteratorInterface<BLOCK_SIZE>,_std::default_delete<testing::internal::ParamIteratorInterface<BLOCK_SIZE>_>_>
                  )(**(code **)(*(long *)(generators->
                                         super__Tuple_impl<0UL,_testing::internal::ParamGenerator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_testing::internal::ParamGenerator<BLOCK_SIZE>_>
                                         ).
                                         super__Tuple_impl<1UL,_testing::internal::ParamGenerator<BLOCK_SIZE>_>
                                         .
                                         super__Head_base<1UL,_testing::internal::ParamGenerator<BLOCK_SIZE>,_false>
                                         ._M_head_impl.impl_.
                                         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<BLOCK_SIZE>,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + 0x10))();
  std::
  _Tuple_impl<0ul,testing::internal::ParamIterator<void(*)(short_const*,short_const*,unsigned_char*,long*,int,int)>,testing::internal::ParamIterator<BLOCK_SIZE>>
  ::
  _Tuple_impl<testing::internal::ParamIterator<void(*)(short_const*,short_const*,unsigned_char*,long*,int,int)>,testing::internal::ParamIterator<BLOCK_SIZE>,void>
            ((_Tuple_impl<0ul,testing::internal::ParamIterator<void(*)(short_const*,short_const*,unsigned_char*,long*,int,int)>,testing::internal::ParamIterator<BLOCK_SIZE>>
              *)&this->begin_,&local_40,&local_38);
  if (local_38.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<BLOCK_SIZE>,_std::default_delete<testing::internal::ParamIteratorInterface<BLOCK_SIZE>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<BLOCK_SIZE>_*,_std::default_delete<testing::internal::ParamIteratorInterface<BLOCK_SIZE>_>_>
      .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<BLOCK_SIZE>_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_data<testing::internal::ParamIteratorInterface<BLOCK_SIZE>,_std::default_delete<testing::internal::ParamIteratorInterface<BLOCK_SIZE>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_38.impl_._M_t.
                          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<BLOCK_SIZE>,_std::default_delete<testing::internal::ParamIteratorInterface<BLOCK_SIZE>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<BLOCK_SIZE>_*,_std::default_delete<testing::internal::ParamIteratorInterface<BLOCK_SIZE>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<BLOCK_SIZE>_*,_false>
                          ._M_head_impl + 8))();
  }
  if (local_40.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>_*,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>_>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_40.impl_._M_t.
                          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>_*,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>_*,_false>
                          ._M_head_impl + 8))();
  }
  local_40.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>_*,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>_*,_false>
  ._M_head_impl._0_4_ =
       (*((generators->
          super__Tuple_impl<0UL,_testing::internal::ParamGenerator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_testing::internal::ParamGenerator<BLOCK_SIZE>_>
          ).
          super__Head_base<0UL,_testing::internal::ParamGenerator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_false>
          ._M_head_impl.impl_.
          super___shared_ptr<const_testing::internal::ParamGeneratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->_vptr_ParamGeneratorInterface[3])();
  local_40.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>_*,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>_*,_false>
  ._M_head_impl._4_4_ = extraout_var_00;
  local_38.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<BLOCK_SIZE>,_std::default_delete<testing::internal::ParamIteratorInterface<BLOCK_SIZE>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<BLOCK_SIZE>_*,_std::default_delete<testing::internal::ParamIteratorInterface<BLOCK_SIZE>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<BLOCK_SIZE>_*,_false>.
  _M_head_impl = (unique_ptr<testing::internal::ParamIteratorInterface<BLOCK_SIZE>,_std::default_delete<testing::internal::ParamIteratorInterface<BLOCK_SIZE>_>_>
                  )(**(code **)(*(long *)(generators->
                                         super__Tuple_impl<0UL,_testing::internal::ParamGenerator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_testing::internal::ParamGenerator<BLOCK_SIZE>_>
                                         ).
                                         super__Tuple_impl<1UL,_testing::internal::ParamGenerator<BLOCK_SIZE>_>
                                         .
                                         super__Head_base<1UL,_testing::internal::ParamGenerator<BLOCK_SIZE>,_false>
                                         ._M_head_impl.impl_.
                                         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<BLOCK_SIZE>,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + 0x18))();
  std::
  _Tuple_impl<0ul,testing::internal::ParamIterator<void(*)(short_const*,short_const*,unsigned_char*,long*,int,int)>,testing::internal::ParamIterator<BLOCK_SIZE>>
  ::
  _Tuple_impl<testing::internal::ParamIterator<void(*)(short_const*,short_const*,unsigned_char*,long*,int,int)>,testing::internal::ParamIterator<BLOCK_SIZE>,void>
            ((_Tuple_impl<0ul,testing::internal::ParamIterator<void(*)(short_const*,short_const*,unsigned_char*,long*,int,int)>,testing::internal::ParamIterator<BLOCK_SIZE>>
              *)&this->end_,&local_40,&local_38);
  if (local_38.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<BLOCK_SIZE>,_std::default_delete<testing::internal::ParamIteratorInterface<BLOCK_SIZE>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<BLOCK_SIZE>_*,_std::default_delete<testing::internal::ParamIteratorInterface<BLOCK_SIZE>_>_>
      .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<BLOCK_SIZE>_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_data<testing::internal::ParamIteratorInterface<BLOCK_SIZE>,_std::default_delete<testing::internal::ParamIteratorInterface<BLOCK_SIZE>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_38.impl_._M_t.
                          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<BLOCK_SIZE>,_std::default_delete<testing::internal::ParamIteratorInterface<BLOCK_SIZE>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<BLOCK_SIZE>_*,_std::default_delete<testing::internal::ParamIteratorInterface<BLOCK_SIZE>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<BLOCK_SIZE>_*,_false>
                          ._M_head_impl + 8))();
  }
  if (local_40.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>_*,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>_>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_40.impl_._M_t.
                          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>_*,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>_*,_false>
                          ._M_head_impl + 8))();
  }
  p_Var1 = &(this->begin_).
            super__Tuple_impl<0UL,_testing::internal::ParamIterator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_testing::internal::ParamIterator<BLOCK_SIZE>_>
  ;
  if (is_end) {
    p_Var1 = &(this->end_).
              super__Tuple_impl<0UL,_testing::internal::ParamIterator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_testing::internal::ParamIterator<BLOCK_SIZE>_>
    ;
  }
  std::
  _Tuple_impl<0UL,_testing::internal::ParamIterator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_testing::internal::ParamIterator<BLOCK_SIZE>_>
  ::_Tuple_impl(&(this->current_).
                 super__Tuple_impl<0UL,_testing::internal::ParamIterator<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int)>,_testing::internal::ParamIterator<BLOCK_SIZE>_>
                ,p_Var1);
  (this->current_value_).
  super___shared_ptr<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->current_value_).
  super___shared_ptr<std::tuple<void_(*)(const_short_*,_const_short_*,_unsigned_char_*,_long_*,_int,_int),_BLOCK_SIZE>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ComputeCurrentValue(this);
  return;
}

Assistant:

IteratorImpl(const ParamGeneratorInterface<ParamType>* base,
                 const std::tuple<ParamGenerator<T>...>& generators,
                 bool is_end)
        : base_(base),
          begin_(std::get<I>(generators).begin()...),
          end_(std::get<I>(generators).end()...),
          current_(is_end ? end_ : begin_) {
      ComputeCurrentValue();
    }